

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O0

SHARED_P shared_lock(int idx,int mode)

{
  int iVar1;
  int r;
  int mode_local;
  int idx_local;
  
  iVar1 = shared_mux(idx,mode);
  if (iVar1 == 0) {
    if ((shared_lt[idx].lkcnt == 0) || (iVar1 = shared_map(idx), iVar1 == 0)) {
      if ((shared_lt[idx].p == (BLKHEAD *)0x0) && (iVar1 = shared_map(idx), iVar1 != 0)) {
        shared_demux(idx,mode);
        _mode_local = (BLKHEAD *)0x0;
      }
      else if (((((shared_lt[idx].p)->s).ID[0] == 'J') && (((shared_lt[idx].p)->s).ID[1] == 'B')) &&
              (((shared_lt[idx].p)->s).tflag == '\x01')) {
        if ((mode & 1U) == 0) {
          shared_lt[idx].lkcnt = shared_lt[idx].lkcnt + 1;
        }
        else {
          shared_lt[idx].lkcnt = -1;
          shared_gt[idx].nprocdebug = shared_gt[idx].nprocdebug + 1;
        }
        shared_lt[idx].seekpos = 0;
        _mode_local = shared_lt[idx].p + 1;
      }
      else {
        shared_demux(idx,mode);
        _mode_local = (BLKHEAD *)0x0;
      }
    }
    else {
      shared_demux(idx,mode);
      _mode_local = (BLKHEAD *)0x0;
    }
  }
  else {
    _mode_local = (BLKHEAD *)0x0;
  }
  return _mode_local;
}

Assistant:

SHARED_P shared_lock(int idx, int mode)         /* lock given segment for exclusive access */
 { int r;

   if (shared_mux(idx, mode))  return(NULL);    /* idx checked by shared_mux */
   if (0 != shared_lt[idx].lkcnt)               /* are we already locked ?? */
     if (SHARED_OK != (r = shared_map(idx)))
       { shared_demux(idx, mode); 
         return(NULL);
       }
   if (NULL == shared_lt[idx].p)                /* stupid pointer ?? */
     if (SHARED_OK != (r = shared_map(idx)))
       { shared_demux(idx, mode); 
         return(NULL);
       }
   if ((SHARED_ID_0 != (shared_lt[idx].p)->s.ID[0]) || (SHARED_ID_1 != (shared_lt[idx].p)->s.ID[1]) || (BLOCK_SHARED != (shared_lt[idx].p)->s.tflag))
     { shared_demux(idx, mode);
       return(NULL);
     }
   if (mode & SHARED_RDWRITE)
     { shared_lt[idx].lkcnt = -1;

       shared_gt[idx].nprocdebug++;
     }

   else shared_lt[idx].lkcnt++;
   shared_lt[idx].seekpos = 0L;                 /* r/w pointer positioned at beg of block */
   return((SHARED_P)((shared_lt[idx].p) + 1));
 }